

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O2

int32 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this,int64 position)

{
  int iVar1;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    iVar1 = fseeko((FILE *)this->file_,position,0);
    return iVar1;
  }
  return -1;
}

Assistant:

int32 MkvWriter::Position(int64 position) {
  if (!file_)
    return -1;

#ifdef _MSC_VER
  return _fseeki64(file_, position, SEEK_SET);
#elif defined(_WIN32)
  return fseeko64(file_, static_cast<off_t>(position), SEEK_SET);
#else
  return fseeko(file_, static_cast<off_t>(position), SEEK_SET);
#endif
}